

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

Float __thiscall pbrt::ParameterDictionary::UpgradeBlackbody(ParameterDictionary *this,string *name)

{
  __type_conflict _Var1;
  bool bVar2;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  size_t sVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  ParsedParameter *p;
  iterator __end1;
  iterator __begin1;
  ParsedParameterVector *__range1;
  Float scale;
  ParsedParameter *__rhs;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffffd0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_28;
  undefined4 in_stack_ffffffffffffffe8;
  float fVar5;
  
  fVar5 = 1.0;
  local_28 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::begin(in_RDI);
  this_00 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
            InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            ::end(in_stack_ffffffffffffffd0);
  do {
    if (local_28 == this_00) {
      return fVar5;
    }
    __rhs = (ParsedParameter *)(local_28->alloc).memoryResource;
    _Var1 = std::operator==(in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(fVar5,in_stack_ffffffffffffffe8));
    if ((_Var1) &&
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this_00,(char *)__rhs), bVar2)) {
      sVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(&__rhs->floats);
      if (sVar3 != 2) {
        ErrorExit((FileLoc *)this_00,(char *)__rhs);
      }
      pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (&__rhs->floats,1);
      fVar5 = *pvVar4 * fVar5;
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::pop_back(this_00);
    }
    local_28 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_28->ptr;
  } while( true );
}

Assistant:

Float ParameterDictionary::UpgradeBlackbody(const std::string &name) {
    Float scale = 1;
    for (ParsedParameter *p : params) {
        if (p->name == name && p->type == "blackbody") {
            if (p->floats.size() != 2)
                ErrorExit(&p->loc,
                          "Expected two values for legacy \"blackbody\" parameter.");
            scale *= p->floats[1];
            p->floats.pop_back();
        }
    }
    return scale;
}